

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O1

bool __thiscall
QPDFNumberTreeObjectHelper::findObjectAtOrBelow
          (QPDFNumberTreeObjectHelper *this,numtree_number idx,QPDFObjectHandle *oh,
          numtree_number *offset)

{
  ulong uVar1;
  bool bVar2;
  iterator i;
  ulong local_88;
  iterator local_80;
  iterator local_50;
  
  local_88 = idx;
  find(&local_80,this,idx,true);
  end(&local_50,this);
  bVar2 = NNTreeIterator::operator==
                    (local_80.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_50.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&local_50);
  if (!bVar2) {
    iterator::updateIValue(&local_80);
    (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_80.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(oh->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_80.ivalue.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
    iterator::updateIValue(&local_80);
    if ((long)(local_88 ^ local_80.ivalue.first) < 0) {
      QIntC::range_check_subtract_error<long_long>((longlong *)&local_88,&local_80.ivalue.first);
    }
    uVar1 = local_88;
    iterator::updateIValue(&local_80);
    *offset = uVar1 - local_80.ivalue.first;
  }
  iterator::~iterator(&local_80);
  return !bVar2;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::findObjectAtOrBelow(
    numtree_number idx, QPDFObjectHandle& oh, numtree_number& offset)
{
    auto i = find(idx, true);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    QIntC::range_check_subtract(idx, i->first);
    offset = idx - i->first;
    return true;
}